

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenIndex BinaryenStructTypeGetNumFields(BinaryenHeapType heapType)

{
  HeapTypeKind HVar1;
  Struct *pSVar2;
  HeapType local_10;
  HeapType ht;
  
  local_10.id = heapType;
  HVar1 = wasm::HeapType::getKind(&local_10);
  if (HVar1 == Struct) {
    pSVar2 = wasm::HeapType::getStruct(&local_10);
    return (BinaryenIndex)
           ((ulong)((long)(pSVar2->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pSVar2->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 4);
  }
  __assert_fail("ht.isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x143,"BinaryenIndex BinaryenStructTypeGetNumFields(BinaryenHeapType)");
}

Assistant:

BinaryenIndex BinaryenStructTypeGetNumFields(BinaryenHeapType heapType) {
  auto ht = HeapType(heapType);
  assert(ht.isStruct());
  return ht.getStruct().fields.size();
}